

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void codeTableLocks(Parse *pParse)

{
  TableLock *pTVar1;
  char *zP4;
  int addr;
  Vdbe *p;
  long lVar2;
  long lVar3;
  
  p = sqlite3GetVdbe(pParse);
  if (0 < pParse->nTableLock) {
    lVar2 = 0x10;
    lVar3 = 0;
    do {
      pTVar1 = pParse->aTableLock;
      zP4 = *(char **)((long)&pTVar1->iDb + lVar2);
      addr = sqlite3VdbeAddOp3(p,0x9f,*(int *)((long)pTVar1 + lVar2 + -0x10),
                               *(int *)((long)pTVar1 + lVar2 + -0xc),
                               (uint)*(byte *)((long)pTVar1 + lVar2 + -8));
      sqlite3VdbeChangeP4(p,addr,zP4,-1);
      lVar3 = lVar3 + 1;
      lVar2 = lVar2 + 0x18;
    } while (lVar3 < pParse->nTableLock);
  }
  return;
}

Assistant:

static void codeTableLocks(Parse *pParse){
  int i;
  Vdbe *pVdbe; 

  pVdbe = sqlite3GetVdbe(pParse);
  assert( pVdbe!=0 ); /* sqlite3GetVdbe cannot fail: VDBE already allocated */

  for(i=0; i<pParse->nTableLock; i++){
    TableLock *p = &pParse->aTableLock[i];
    int p1 = p->iDb;
    sqlite3VdbeAddOp4(pVdbe, OP_TableLock, p1, p->iTab, p->isWriteLock,
                      p->zLockName, P4_STATIC);
  }
}